

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O1

time_t license::seconds_from_epoch(string *timeString)

{
  int iVar1;
  invalid_argument *piVar2;
  time_t tVar3;
  long *plVar4;
  long *plVar5;
  int day;
  int month;
  int year;
  tm tm;
  int local_a4;
  int local_a0;
  int local_9c;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  tm local_58;
  
  if (timeString->_M_string_length == 10) {
    iVar1 = __isoc99_sscanf((timeString->_M_dataplus)._M_p,"%4d-%2d-%2d",&local_9c,&local_a0,
                            &local_a4);
    if (iVar1 != 3) {
      iVar1 = __isoc99_sscanf((timeString->_M_dataplus)._M_p,"%4d/%2d/%2d",&local_9c,&local_a0,
                              &local_a4);
      if (iVar1 != 3) {
        piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::operator+(&local_78,"Date [",timeString);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
        local_98 = (long *)*plVar4;
        plVar5 = plVar4 + 2;
        if (local_98 == plVar5) {
          local_88 = *plVar5;
          lStack_80 = plVar4[3];
          local_98 = &local_88;
        }
        else {
          local_88 = *plVar5;
        }
        local_90 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::invalid_argument::invalid_argument(piVar2,(string *)&local_98);
        __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    }
  }
  else {
    if (timeString->_M_string_length != 8) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&local_78,"Date [",timeString);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
      local_98 = (long *)*plVar4;
      plVar5 = plVar4 + 2;
      if (local_98 == plVar5) {
        local_88 = *plVar5;
        lStack_80 = plVar4[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar5;
      }
      local_90 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::invalid_argument::invalid_argument(piVar2,(string *)&local_98);
      __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    iVar1 = __isoc99_sscanf((timeString->_M_dataplus)._M_p,"%4d%2d%2d",&local_9c,&local_a0,&local_a4
                           );
    if (iVar1 != 3) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar2,"Date not recognized");
      __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  local_58.tm_isdst = -1;
  local_58.tm_year = local_9c + -0x76c;
  local_58.tm_mon = local_a0 + -1;
  local_58.tm_mday = local_a4;
  local_58.tm_hour = 0;
  local_58.tm_sec = 0;
  local_58.tm_min = 0;
  local_58.tm_wday = -1;
  local_58.tm_yday = -1;
  tVar3 = mktime(&local_58);
  return tVar3;
}

Assistant:

time_t seconds_from_epoch(const string &timeString) {
	int year, month, day;
	tm tm;
	if (timeString.size() == 8) {
		const int nfield = sscanf(timeString.c_str(), "%4d%2d%2d", &year, &month, &day);
		if (nfield != 3) {
			throw invalid_argument("Date not recognized");
		}
	} else if (timeString.size() == 10) {
		const int nfield = sscanf(timeString.c_str(), "%4d-%2d-%2d", &year, &month, &day);
		if (nfield != 3) {
			const int nfield = sscanf(timeString.c_str(), "%4d/%2d/%2d", &year, &month, &day);
			if (nfield != 3) {
				throw invalid_argument("Date [" + timeString + "] not recognized");
			}
		}
	} else {
		throw invalid_argument("Date [" + timeString + "] not recognized");
	}
	tm.tm_isdst = -1;
	tm.tm_year = year - 1900;
	tm.tm_mon = month - 1;
	tm.tm_mday = day;
	tm.tm_hour = 0;
	tm.tm_min = 0;
	tm.tm_sec = 0;
	tm.tm_yday = -1;
	tm.tm_wday = -1;
	return mktime(&tm);
}